

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEngine::setWriteNotificationEnabled(QSocks5SocketEngine *this,bool enable)

{
  byte bVar1;
  QSocks5SocketEnginePrivate *pQVar2;
  long lVar3;
  byte in_SIL;
  QSocks5SocketEnginePrivate *d;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar2 = d_func((QSocks5SocketEngine *)0x375530);
  pQVar2->writeNotificationEnabled = (bool)(bVar1 & 1);
  if ((((bVar1 & 1) != 0) &&
      ((pQVar2->super_QAbstractSocketEnginePrivate).socketState == ConnectedState)) &&
     ((pQVar2->mode != ConnectMode ||
      (lVar3 = (**(code **)(*(long *)&pQVar2->data->controlSocket->super_QAbstractSocket + 0xa8))(),
      lVar3 == 0)))) {
    QSocks5SocketEnginePrivate::emitWriteNotification
              ((QSocks5SocketEnginePrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
    pQVar2->writeNotificationActivated = false;
  }
  return;
}

Assistant:

void QSocks5SocketEngine::setWriteNotificationEnabled(bool enable)
{
    Q_D(QSocks5SocketEngine);
    d->writeNotificationEnabled = enable;
    if (enable && d->socketState == QAbstractSocket::ConnectedState) {
        if (d->mode == QSocks5SocketEnginePrivate::ConnectMode && d->data->controlSocket->bytesToWrite())
            return; // will be emitted as a result of bytes written
       d->emitWriteNotification();
       d->writeNotificationActivated = false;
    }
}